

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

TPZFMatrix<TFad<6,_double>_> * __thiscall
TPZTensor::operator_cast_to_TPZFMatrix(TPZTensor<TFad<6,_double>_> *this)

{
  TPZFMatrix<TFad<6,_double>_> *this_00;
  TFad<6,_double> *pTVar1;
  TFad<6,_double> *col;
  TPZFMatrix<TFad<6,_double>_> *in_RDI;
  TPZFMatrix<TFad<6,_double>_> *result;
  TFad<6,_double> *in_stack_ffffffffffffff28;
  TFad<6,_double> *in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff40;
  int64_t in_stack_ffffffffffffff48;
  TPZFMatrix<TFad<6,_double>_> *in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  TPZFMatrix<TFad<6,_double>_> *in_stack_ffffffffffffffb0;
  
  TPZFMatrix<TFad<6,_double>_>::TPZFMatrix
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  TPZTensor<TFad<6,_double>_>::XX((TPZTensor<TFad<6,_double>_> *)0x14b57dc);
  TPZFMatrix<TFad<6,_double>_>::operator()
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZTensor<TFad<6,_double>_>::XY((TPZTensor<TFad<6,_double>_> *)0x14b5828);
  TPZFMatrix<TFad<6,_double>_>::operator()
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZFMatrix<TFad<6,_double>_>::operator()
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZTensor<TFad<6,_double>_>::XZ((TPZTensor<TFad<6,_double>_> *)0x14b58a3);
  TPZFMatrix<TFad<6,_double>_>::operator()
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZFMatrix<TFad<6,_double>_>::operator()
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZTensor<TFad<6,_double>_>::YY((TPZTensor<TFad<6,_double>_> *)0x14b5918);
  TPZFMatrix<TFad<6,_double>_>::operator()
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZTensor<TFad<6,_double>_>::YZ((TPZTensor<TFad<6,_double>_> *)0x14b5959);
  this_00 = (TPZFMatrix<TFad<6,_double>_> *)
            TPZFMatrix<TFad<6,_double>_>::operator()
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40
                      );
  pTVar1 = TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  col = TPZFMatrix<TFad<6,_double>_>::operator()(this_00,(int64_t)pTVar1,in_stack_ffffffffffffff40);
  TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZTensor<TFad<6,_double>_>::ZZ((TPZTensor<TFad<6,_double>_> *)0x14b59d0);
  pTVar1 = TPZFMatrix<TFad<6,_double>_>::operator()(this_00,(int64_t)pTVar1,(int64_t)col);
  TFad<6,_double>::operator=(pTVar1,in_stack_ffffffffffffff28);
  return in_RDI;
}

Assistant:

operator TPZFMatrix<T>() const {
        TPZFMatrix<T> result(3, 3);
        result(0, 0) = XX();
        result(0, 1) = result(1, 0) = XY();
        result(0, 2) = result(2, 0) = XZ();
        result(1, 1) = YY();
        result(1, 2) = result(2, 1) = YZ();
        result(2, 2) = ZZ();
        return result;
    }